

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::handle_mouse_down(Plotter *this,int px,int py)

{
  pointer puVar1;
  ulong uVar2;
  
  if ((this->drag_view != false) || (this->drag_trace != false)) {
    return;
  }
  if (-1 < (py | px)) {
    uVar2 = (ulong)((this->view).swid * py + px);
    puVar1 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((uVar2 < (ulong)((long)(this->grid).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) &&
       (puVar1[uVar2] != 0xffffffffffffffff)) {
      detect_marker_click(this,px,py,false,true);
      if (this->passive_marker_click_behavior != PASSIVE_MARKER_CLICK_DRAG_TRACE) {
        this->drag_view = true;
        this->dragx = px;
        this->dragy = py;
        return;
      }
      this->drag_trace = true;
      return;
    }
  }
  this->drag_view = true;
  this->dragx = px;
  this->dragy = py;
  set_curr_func(this,0xffffffffffffffff);
  return;
}

Assistant:

void Plotter::handle_mouse_down(int px, int py) {
    if (!drag_view && !drag_trace) {
        if (px >= 0 && py >= 0 &&
                py * view.swid + px < grid.size() &&
                ~grid[py * view.swid + px]) {
            // Show marker and either trace or drag view
            detect_marker_click(px, py, false, true);
            if (passive_marker_click_behavior ==
                    PASSIVE_MARKER_CLICK_DRAG_TRACE) {
                drag_trace = true;
            } else {
                // Drag view
                drag_view = true;
                dragx = px; dragy = py;
            }
        } else {
            // Begin dragging view
            drag_view = true;
            dragx = px; dragy = py;
            set_curr_func(-1);
        }
    }
}